

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ActivationParams::clear_NonlinearityType(ActivationParams *this)

{
  uint32 uVar1;
  
  uVar1 = this->_oneof_case_[0];
  if ((int)uVar1 < 0x1f) {
    if ((int)uVar1 < 0x14) {
      if (((uVar1 != 5) && (uVar1 != 10)) && (uVar1 != 0xf)) goto LAB_00200eef;
    }
    else if (((uVar1 != 0x14) && (uVar1 != 0x19)) && (uVar1 != 0x1e)) goto LAB_00200eef;
  }
  else if ((int)uVar1 < 0x32) {
    if (((uVar1 != 0x1f) && (uVar1 != 0x28)) && (uVar1 != 0x29)) goto LAB_00200eef;
  }
  else if ((int)uVar1 < 0x46) {
    if ((uVar1 != 0x32) && (uVar1 != 0x3c)) goto LAB_00200eef;
  }
  else if ((uVar1 != 0x46) && (uVar1 != 0x47)) goto LAB_00200eef;
  if ((this->NonlinearityType_).linear_ != (ActivationLinear *)0x0) {
    (*(((this->NonlinearityType_).linear_)->super_MessageLite)._vptr_MessageLite[1])();
  }
LAB_00200eef:
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void ActivationParams::clear_NonlinearityType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.ActivationParams)
  switch (NonlinearityType_case()) {
    case kLinear: {
      delete NonlinearityType_.linear_;
      break;
    }
    case kReLU: {
      delete NonlinearityType_.relu_;
      break;
    }
    case kLeakyReLU: {
      delete NonlinearityType_.leakyrelu_;
      break;
    }
    case kThresholdedReLU: {
      delete NonlinearityType_.thresholdedrelu_;
      break;
    }
    case kPReLU: {
      delete NonlinearityType_.prelu_;
      break;
    }
    case kTanh: {
      delete NonlinearityType_.tanh_;
      break;
    }
    case kScaledTanh: {
      delete NonlinearityType_.scaledtanh_;
      break;
    }
    case kSigmoid: {
      delete NonlinearityType_.sigmoid_;
      break;
    }
    case kSigmoidHard: {
      delete NonlinearityType_.sigmoidhard_;
      break;
    }
    case kELU: {
      delete NonlinearityType_.elu_;
      break;
    }
    case kSoftsign: {
      delete NonlinearityType_.softsign_;
      break;
    }
    case kSoftplus: {
      delete NonlinearityType_.softplus_;
      break;
    }
    case kParametricSoftplus: {
      delete NonlinearityType_.parametricsoftplus_;
      break;
    }
    case NONLINEARITYTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = NONLINEARITYTYPE_NOT_SET;
}